

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_io.cc
# Opt level: O2

void __thiscall
gimage::JPEGImageIO::load
          (JPEGImageIO *this,ImageU8 *image,char *name,int ds,long x,long y,long w,long h)

{
  undefined1 *puVar1;
  int *piVar2;
  size_t sVar3;
  int iVar4;
  FILE *pFVar5;
  long lVar6;
  ulong uVar7;
  IOException *pIVar8;
  sbyte sVar9;
  ulong uVar10;
  size_t __n;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  size_t __n_00;
  long k;
  ulong uVar19;
  allocator local_441;
  ulong local_440;
  ulong local_438;
  void *local_430;
  long local_428;
  long local_420;
  FILE *local_418;
  ulong local_410;
  long local_408;
  valarray<int> nline;
  valarray<int> vline;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  ulong local_390;
  long local_388;
  ulong local_380;
  long local_378;
  ulong local_370;
  jpeg_decompress_struct cinfo;
  jpeg_error_mgr jerr;
  
  local_428 = y;
  local_420 = x;
  iVar4 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name);
  if ((char)iVar4 == '\0') {
    pIVar8 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_3b0,name,&local_441);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nline,
                   "Can only load JPG image (",&local_3b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vline,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nline,")");
    gutil::IOException::IOException(pIVar8,(string *)&vline);
    __cxa_throw(pIVar8,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  pFVar5 = fopen(name,"rb");
  if (pFVar5 == (FILE *)0x0) {
    pIVar8 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_3b0,name,&local_441);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nline,
                   "Cannot open file for reading (",&local_3b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vline,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nline,")");
    gutil::IOException::IOException(pIVar8,(string *)&vline);
    __cxa_throw(pIVar8,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  local_438 = w;
  cinfo.err = (jpeg_error_mgr *)jpeg_std_error(&jerr);
  jpeg_CreateDecompress(&cinfo,0x50,0x290);
  jpeg_stdio_src(&cinfo,pFVar5);
  uVar15 = 1;
  jpeg_read_header(&cinfo,1);
  if (ds < 2) goto LAB_001297f1;
  if ((ds & 7U) == 0) {
    sVar9 = 3;
    cinfo.scale_denom = 8;
LAB_001297e4:
    ds = (uint)ds >> sVar9;
  }
  else {
    if ((ds & 3U) == 0) {
      sVar9 = 2;
      cinfo.scale_denom = 4;
      goto LAB_001297e4;
    }
    if ((ds & 1U) == 0) {
      sVar9 = 1;
      cinfo.scale_denom = 2;
      goto LAB_001297e4;
    }
  }
  uVar15 = (ulong)(uint)ds;
LAB_001297f1:
  local_418 = pFVar5;
  jpeg_start_decompress(&cinfo);
  uVar19 = (ulong)cinfo.output_width;
  local_440 = (ulong)cinfo.output_height;
  lVar14 = (long)cinfo.output_components;
  if (w < 0) {
    local_438 = (long)(uVar15 + uVar19 + -1) / (long)uVar15;
  }
  if (h < 0) {
    h = (long)(local_440 + uVar15 + -1) / (long)uVar15;
  }
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize(image,local_438,h,lVar14);
  sVar3 = image->n;
  __n = -sVar3;
  if (0 < (long)sVar3) {
    __n = sVar3;
  }
  memset(image->pixel,0,__n);
  uVar13 = 0xffffffffffffffff;
  if (-1 < (long)(lVar14 * uVar19)) {
    uVar13 = lVar14 * uVar19;
  }
  local_430 = operator_new__(uVar13);
  if ((((local_428 == 0 && local_420 == 0) && ((uint)uVar15 < 2)) && (local_438 == uVar19)) &&
     (h == local_440)) {
    uVar13 = 0;
    uVar15 = (ulong)(uint)cinfo.output_components;
    if (cinfo.output_components < 1) {
      uVar15 = uVar13;
    }
    for (; uVar13 != local_440; uVar13 = uVar13 + 1) {
      jpeg_read_scanlines(&cinfo,&local_430,1);
      lVar14 = 0;
      for (uVar10 = 0; uVar10 != uVar19; uVar10 = uVar10 + 1) {
        lVar14 = (long)(int)lVar14;
        for (lVar11 = 0; uVar15 * 8 != lVar11; lVar11 = lVar11 + 8) {
          puVar1 = (undefined1 *)((long)local_430 + lVar14);
          lVar14 = lVar14 + 1;
          *(undefined1 *)(*(long *)(*(long *)((long)image->img + lVar11) + uVar13 * 8) + uVar10) =
               *puVar1;
        }
      }
    }
    jpeg_finish_decompress(&cinfo);
    pFVar5 = local_418;
  }
  else {
    local_408 = CONCAT44(local_408._4_4_,(uint)uVar15);
    nline._M_size._0_4_ = 0;
    __n_00 = local_438 * lVar14;
    local_390 = h;
    std::valarray<int>::valarray(&vline,(int *)&nline,__n_00);
    local_3b0._M_dataplus._M_p._0_4_ = 0;
    std::valarray<int>::valarray(&nline,(int *)&local_3b0,__n_00);
    lVar11 = uVar15 * local_428;
    for (uVar13 = 0; ((long)uVar13 < lVar11 && (uVar13 < local_440)); uVar13 = uVar13 + 1) {
      jpeg_read_scanlines(&cinfo,&local_430,1);
    }
    uVar10 = 0;
    uVar13 = -local_428;
    if (-local_428 == 0 || 0 < local_428) {
      uVar13 = uVar10;
    }
    iVar4 = 0;
    if (0 < local_420) {
      iVar4 = (int)local_420;
    }
    local_380 = (ulong)(uint)(iVar4 * (int)local_408 * cinfo.output_components);
    local_410 = -local_420;
    if (-local_420 == 0 || 0 < local_420) {
      local_410 = uVar10;
    }
    lVar11 = local_410 * lVar14;
    if (0 < cinfo.output_components) {
      uVar10 = (ulong)(uint)cinfo.output_components;
    }
    local_388 = lVar11 * 4;
    local_408 = uVar10 * 8;
    for (; ((long)uVar13 < (long)local_390 &&
           (local_378 = (uVar13 + local_428) * uVar15, local_378 < (long)local_440));
        uVar13 = uVar13 + 1) {
      local_3b0._M_dataplus._M_p._0_4_ = 0;
      std::valarray<int>::operator=(&vline,(int *)&local_3b0);
      local_3b0._M_dataplus._M_p._0_4_ = 0;
      std::valarray<int>::operator=(&nline,(int *)&local_3b0);
      uVar7 = 0;
      while ((lVar6 = lVar11, uVar12 = local_410, uVar7 < uVar15 &&
             (local_370 = uVar7, (long)(local_378 + uVar7) < (long)local_440))) {
        jpeg_read_scanlines(&cinfo,&local_430,1);
        lVar6 = local_388;
        uVar7 = local_380;
        for (uVar12 = local_410;
            ((long)uVar12 < (long)local_438 &&
            (lVar16 = (local_420 + uVar12) * uVar15, lVar16 < (long)uVar19)); uVar12 = uVar12 + 1) {
          for (uVar17 = 0; (uVar17 < uVar15 && ((long)(lVar16 + uVar17) < (long)uVar19));
              uVar17 = uVar17 + 1) {
            for (uVar18 = 0; uVar10 != uVar18; uVar18 = uVar18 + 1) {
              piVar2 = (int *)((long)vline._M_data + uVar18 * 4 + lVar6);
              *piVar2 = *piVar2 + (uint)*(byte *)((long)local_430 + uVar18 + (long)(int)uVar7);
              piVar2 = (int *)((long)nline._M_data + uVar18 * 4 + lVar6);
              *piVar2 = *piVar2 + 1;
            }
            uVar7 = (ulong)(uint)((int)uVar7 + (int)uVar18);
          }
          lVar6 = lVar6 + lVar14 * 4;
        }
        uVar7 = local_370 + 1;
      }
      for (; ((long)uVar12 < (long)local_438 &&
             ((long)((local_420 + uVar12) * uVar15) < (long)uVar19)); uVar12 = uVar12 + 1) {
        for (lVar16 = 0; local_408 != lVar16; lVar16 = lVar16 + 8) {
          if (0 < nline._M_data[lVar6]) {
            *(char *)(*(long *)(*(long *)((long)image->img + lVar16) + uVar13 * 8) + uVar12) =
                 (char)(vline._M_data[lVar6] / nline._M_data[lVar6]);
          }
          lVar6 = lVar6 + 1;
        }
      }
    }
    if (cinfo.output_scanline < cinfo.output_height) {
      jpeg_abort_decompress(&cinfo);
    }
    else {
      jpeg_finish_decompress(&cinfo);
    }
    pFVar5 = local_418;
    operator_delete(nline._M_data);
    operator_delete(vline._M_data);
  }
  jpeg_destroy_decompress(&cinfo);
  fclose(pFVar5);
  if (local_430 != (void *)0x0) {
    operator_delete__(local_430);
  }
  return;
}

Assistant:

void JPEGImageIO::load(ImageU8 &image, const char *name, int ds, long x, long y,
                       long w, long h) const
{
  long  width, height;
  int   depth;
  struct jpeg_decompress_struct cinfo;
  struct jpeg_error_mgr jerr;
  JSAMPROW row=0;
  FILE   *in=0;

  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load JPG image ("+std::string(name)+")");
  }

  // open output file using C methods

  in=fopen(name, "rb");

  if (in == 0)
  {
    throw gutil::IOException("Cannot open file for reading ("+std::string(name)+")");
  }

  // installing standard error handler, create compression object and set output file

  cinfo.err=jpeg_std_error(&jerr);
  jpeg_create_decompress(&cinfo);
  jpeg_stdio_src(&cinfo, in);

  // read header information

  jpeg_read_header(&cinfo, TRUE);

  // use scaling possibility of JPEG library for increasing speed

  ds=std::max(1, ds);

  if (ds > 1)
  {
    if (ds%8 == 0)
    {
      cinfo.scale_denom=8;
      ds/=8;
    }
    else if (ds%4 == 0)
    {
      cinfo.scale_denom=4;
      ds/=4;
    }
    else if (ds%2 == 0)
    {
      cinfo.scale_denom=2;
      ds/=2;
    }
  }

  // start decompression

  jpeg_start_decompress(&cinfo);

  // get size and depth

  width=static_cast<long>(cinfo.output_width);
  height=static_cast<long>(cinfo.output_height);
  depth=cinfo.output_components;

  if (w < 0)
  {
    w=(width+ds-1)/ds;
  }

  if (h < 0)
  {
    h=(height+ds-1)/ds;
  }

  image.setSize(w, h, depth);
  image.clear();

  // allocate image row buffer

  row=new JSAMPLE [width*depth];

  // load downscaled part?

  if (ds > 1 || x != 0 || y != 0 || w != width || h != height)
  {
    std::valarray<ImageU8::work_t> vline(0, w*depth);
    std::valarray<int> nline(0, w*depth);

    // skip the first y*ds image rows

    for (long k=0; k<y*ds && k<height; k++)
    {
      jpeg_read_scanlines(&cinfo, &row, 1);
    }

    for (long k=std::max(0l, -y); k<h && (y+k)*ds<height; k++)
    {
      // load downscaled line

      vline=0;
      nline=0;

      for (long kk=0; kk<ds && kk+(y+k)*ds<height; kk++)
      {
        jpeg_read_scanlines(&cinfo, &row, 1);

        int  jj=std::max(0l, x)*ds*depth;
        long j=std::max(0l, -x)*depth;

        for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
        {
          for (int ii=0; ii<ds && (x+i)*ds+ii<width; ii++)
          {
            for (int d=0; d<depth; d++)
            {
              ImageU8::store_t v=static_cast<ImageU8::store_t>(row[jj++]);

              if (image.isValidS(v))
              {
                vline[j+d]+=v;
                nline[j+d]++;
              }
            }
          }

          j+=depth;
        }
      }

      // store line into image

      long j=std::max(0l, -x)*depth;

      for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
      {
        for (int d=0; d<depth; d++)
        {
          if (nline[j] > 0)
          {
            image.set(i, k, d, static_cast<ImageU8::store_t>(vline[j]/nline[j]));
          }

          j++;
        }
      }
    }

    if (cinfo.output_scanline < cinfo.output_height)
    {
      jpeg_abort_decompress(&cinfo);
    }
    else
    {
      jpeg_finish_decompress(&cinfo);
    }
  }
  else // load whole image
  {
    for (long k=0; k<height; k++)
    {
      jpeg_read_scanlines(&cinfo, &row, 1);

      int j=0;

      for (long i=0; i<width; i++)
      {
        for (int d=0; d<depth; d++)
        {
          image.set(i, k, d, static_cast<ImageU8::store_t>(row[j++]));
        }
      }
    }

    jpeg_finish_decompress(&cinfo);
  }

  // close object and input stream

  jpeg_destroy_decompress(&cinfo);
  fclose(in);
  delete [] row;
}